

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::scan
               (WriteUpdater *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *pPVar5;
  _func_void_WriteUpdater_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      goto LAB_00acec4d;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_00ace868:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_00acec4d;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                     ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                     super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00ace6af;
  case LoopId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace124;
  case BreakId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00acec4d;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                     ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                     super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_00acdf6c;
  case SwitchId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00acec4d;
    }
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x00acdf66;
  case CallId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_00acec4d;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_00acec4d;
    }
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_00acec4d;
    }
    break;
  case LocalSetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace45b;
  case GlobalGetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_00acec4d;
    }
    break;
  case GlobalSetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace124;
  case LoadId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id == LoadId) {
      pEVar1 = pEVar1 + 3;
      goto LAB_00ace6af;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Load]";
    goto LAB_00acec4d;
  case StoreId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace420;
  case ConstId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_00acec4d;
    }
    break;
  case UnaryId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace45b;
  case BinaryId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace3af;
  case SelectId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace68b;
  case DropId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case ReturnId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00acec4d;
    }
    goto LAB_00acdf5d;
  case MemorySizeId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_00acec4d;
    }
    break;
  case MemoryGrowId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case NopId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_00acec4d;
    }
    break;
  case UnreachableId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_00acec4d;
    }
    break;
  case AtomicRMWId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace4a4;
  case AtomicCmpxchgId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitAtomicCmpxchg,currp)
    ;
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace495;
  case AtomicWaitId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace149;
  case AtomicNotifyId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace3af;
  case AtomicFenceId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_00acec4d;
    }
    break;
  case SIMDExtractId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace45b;
  case SIMDReplaceId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_00acec4d;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_00ace3ba;
  case SIMDShuffleId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace69a;
  case SIMDTernaryId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace149;
  case SIMDShiftId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace3af;
  case SIMDLoadId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace328;
  case SIMDLoadStoreLaneId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitSIMDLoadStoreLane,
               currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_00acec4d;
    }
LAB_00ace420:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00ace6af;
  case MemoryInitId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace495;
  case DataDropId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_00acec4d;
    }
    break;
  case MemoryCopyId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace68b;
  case MemoryFillId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace68b;
  case PopId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_00acec4d;
    }
    break;
  case RefNullId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_00acec4d;
    }
    break;
  case RefIsNullId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case RefFuncId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_00acec4d;
    }
    break;
  case RefEqId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace69a;
  case TableGetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace124;
  case TableSetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace4a4;
  case TableSizeId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_00acec4d;
    }
    break;
  case TableGrowId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace4a4;
  case TableFillId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTableFill,currp);
    if (pEVar1->_id != TableFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace495;
  case TableCopyId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTableCopy,currp);
    if (pEVar1->_id != TableCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace68b;
  case TableInitId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTableInit,currp);
    if (pEVar1->_id != TableInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace495;
  case TryId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_00acec4d;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_00ace124:
    pEVar1 = pEVar1 + 2;
    goto LAB_00ace6af;
  case TryTableId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTryTable,currp);
    if (pEVar1->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case ThrowId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00acec4d;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_00acec4d;
    }
    break;
  case ThrowRefId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitThrowRef,currp);
    if (pEVar1->_id != ThrowRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case TupleMakeId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_00acec4d;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case RefI31Id:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitRefI31,currp);
    if (pEVar1->_id != RefI31Id) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case I31GetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case CallRefId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_00acec4d;
    }
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case RefCastId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case BrOnId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_00acec4d;
    }
LAB_00ace328:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00ace6af;
  case StructNewId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_00acec4d;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace45b;
  case StructSetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace3af;
  case StructRMWId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStructRMW,currp);
    if (pEVar1->_id != StructRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace3af;
  case StructCmpxchgId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStructCmpxchg,currp)
    ;
    if (pEVar1->_id != StructCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_00acec4d;
    }
LAB_00ace149:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_00ace3ba;
  case ArrayNewId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_00acec4d;
    }
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
LAB_00acdf5d:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x00acdf66:
    if (lVar4 != 0) {
LAB_00acdf6c:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                     ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                     super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArrayNewData,currp);
    if (pEVar1->_id != ArrayNewDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace4a4;
  case ArrayNewElemId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArrayNewElem,currp);
    if (pEVar1->_id != ArrayNewElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace4a4;
  case ArrayNewFixedId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArrayNewFixed,currp)
    ;
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_00acec4d;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace69a;
  case ArraySetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace68b;
  case ArrayLenId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace1f0;
  case ArrayCopyId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_00acec4d;
    }
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_00ace67c;
  case ArrayFillId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_00acec4d;
    }
LAB_00ace67c:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_00ace68b;
  case ArrayInitDataId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArrayInitData,currp)
    ;
    if (pEVar1->_id != ArrayInitDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_00acec4d;
    }
    goto LAB_00acd9e7;
  case ArrayInitElemId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitArrayInitElem,currp)
    ;
    if (pEVar1->_id != ArrayInitElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_00acec4d;
    }
LAB_00acd9e7:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
LAB_00ace495:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
LAB_00ace4a4:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00ace6af;
  case RefAsId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace45b;
  case StringNewId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id == StringNewId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                       ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                       super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.stack,
                   &local_40,(Expression ***)&local_38);
      }
      local_38 = pEVar1 + 2;
      local_40 = scan;
      if (*(long *)(pEVar1 + 2) != 0) {
        SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                       ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                       super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.stack,
                   &local_40,(Expression ***)&local_38);
      }
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_00ace6af;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
    goto LAB_00acec4d;
  case StringConstId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_00acec4d;
    }
    break;
  case StringMeasureId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStringMeasure,currp)
    ;
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_00acec4d;
    }
LAB_00ace45b:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00ace6af;
  case StringEncodeId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStringEncode,currp);
    if (pEVar1->_id == StringEncodeId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,wasm::Visitor<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                       ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                       super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.stack,
                   &local_40,(Expression ***)&local_38);
      }
      Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                 (Expression **)(pEVar1 + 2));
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_00ace6af;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
LAB_00acec4d:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,__function);
  case StringConcatId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace69a;
  case StringEqId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_00acec4d;
    }
LAB_00ace3af:
    currp_00 = pEVar1 + 2;
LAB_00ace3ba:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00ace6af;
  case StringWTF16GetId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStringWTF16Get,currp
              );
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_00acec4d;
    }
    goto LAB_00ace69a;
  case StringSliceWTFId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStringSliceWTF,currp
              );
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_00acec4d;
    }
LAB_00ace68b:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)(pEVar1 + 2));
LAB_00ace69a:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00ace6af;
  case ContNewId:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitContNew,currp);
    if (pEVar1->_id != ContNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_00acec4d;
    }
LAB_00ace1f0:
    pEVar1 = pEVar1 + 1;
LAB_00ace6af:
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                ).super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
                super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)pEVar1);
    return;
  case ContBindId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitContBind,currp);
    if (pEVar1->_id != ContBindId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_00acec4d;
    }
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case SuspendId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitSuspend,currp);
    if (pEVar1->_id != SuspendId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_00acec4d;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitResume,currp);
    if (pEVar1->_id != ResumeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_00acec4d;
    }
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)(pEVar1 + 7));
    uVar2 = (uint)pEVar1[5].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[5].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 5) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeThrowId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitResumeThrow,currp);
    if (pEVar1->_id != ResumeThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_00acec4d;
    }
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)(pEVar1 + 8));
    uVar2 = (uint)pEVar1[6].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[6].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 6) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StackSwitchId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>)
              .super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>;
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,
               Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::doVisitStackSwitch,currp);
    if (pEVar1->_id != StackSwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_00acec4d;
    }
    Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
              (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
               (Expression **)(pEVar1 + 4));
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_00ace868;
        Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::pushTask
                  (&pPVar5->super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }